

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::~VaryingLocationsTest(VaryingLocationsTest *this)

{
  (this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__VaryingLocationsTest_01dbe0f8;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_last_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_first_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

~VaryingLocationsTest()
	{
	}